

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

string * toml::detail::show_char_abi_cxx11_(int c)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type __maxlen;
  char *__s;
  uint in_ESI;
  string *in_RDI;
  int r;
  array<char,_5UL> buf;
  string *in_hex;
  allocator<char> *in_stack_ffffffffffffff98;
  array<char,_5UL> *this_00;
  array<char,_5UL> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  string *__s_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  array<char,_5UL> local_21 [4];
  allocator<char> local_d;
  uint local_c;
  
  __s_00 = in_RDI;
  local_c = in_ESI;
  iVar1 = isgraph(in_ESI);
  if (iVar1 == 0) {
    this_00 = local_21;
    std::array<char,_5UL>::fill(in_stack_ffffffffffffffa0,this_00->_M_elems);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::array<char,_5UL>::data((array<char,_5UL> *)0x382a59);
    __maxlen = std::array<char,_5UL>::size(this_00);
    snprintf((char *)this,__maxlen,"0x%02x",(ulong)(byte)local_c);
    uVar2 = 0;
    std::array<char,_5UL>::data((array<char,_5UL> *)0x382a96);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffffd0),(char *)__s_00,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd6);
    __s = (char *)(ulong)local_c;
    switch(__s) {
    case (char *)0x0:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    default:
      break;
    case (char *)0x9:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    case (char *)0xa:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    case (char *)0xb:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    case (char *)0xc:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    case (char *)0xd:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    case (char *)0x1b:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
      break;
    case (char *)0x20:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(this,__s);
    }
  }
  else {
    iVar1 = (int)(char)(byte)local_c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
               (char)((ulong)in_stack_ffffffffffffffa0 >> 0x38),in_stack_ffffffffffffff98);
    std::allocator<char>::~allocator(&local_d);
  }
  return __s_00;
}

Assistant:

inline std::string show_char(const int c)
{
    using char_type = unsigned char;
    if(std::isgraph(c))
    {
        return std::string(1, static_cast<char>(c));
    }
    else
    {
        std::array<char, 5> buf;
        buf.fill('\0');
        const auto r = std::snprintf(buf.data(), buf.size(), "0x%02x", c & 0xFF);
        assert(r == static_cast<int>(buf.size()) - 1);
        (void) r; // Unused variable warning
        auto in_hex = std::string(buf.data());
        switch(c)
        {
            case char_type('\0'):   {in_hex += "(NUL)";             break;}
            case char_type(' ') :   {in_hex += "(SPACE)";           break;}
            case char_type('\n'):   {in_hex += "(LINE FEED)";       break;}
            case char_type('\r'):   {in_hex += "(CARRIAGE RETURN)"; break;}
            case char_type('\t'):   {in_hex += "(TAB)";             break;}
            case char_type('\v'):   {in_hex += "(VERTICAL TAB)";    break;}
            case char_type('\f'):   {in_hex += "(FORM FEED)";       break;}
            case char_type('\x1B'): {in_hex += "(ESCAPE)";          break;}
            default: break;
        }
        return in_hex;
    }
}